

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::BasicComputeTestInstance::BasicComputeTestInstance
          (BasicComputeTestInstance *this,Context *context,StageFlagVector *stages,bool inRenderPass
          )

{
  VkDescriptorSet destSet;
  RefData<vk::Handle<(vk::HandleType)8>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  RefData<vk::Handle<(vk::HandleType)19>_> data_01;
  RefData<vk::Handle<(vk::HandleType)21>_> data_02;
  RefData<vk::Handle<(vk::HandleType)22>_> data_03;
  RefData<vk::Handle<(vk::HandleType)16>_> data_04;
  RefData<vk::Handle<(vk::HandleType)14>_> data_05;
  RefData<vk::Handle<(vk::HandleType)18>_> data_06;
  VkDeviceSize VVar1;
  VkDevice pVVar2;
  Allocation *pAVar3;
  float *pfVar4;
  VkDeviceSize offset;
  Handle<(vk::HandleType)8> *pHVar5;
  DescriptorPoolBuilder *this_00;
  Handle<(vk::HandleType)21> *pHVar6;
  Handle<(vk::HandleType)22> *pHVar7;
  reference pBufferInfo;
  ProgramCollection<vk::ProgramBinary> *pPVar8;
  ProgramBinary *pPVar9;
  Handle<(vk::HandleType)14> *pHVar10;
  Handle<(vk::HandleType)16> *pHVar11;
  uint uVar12;
  VkPipelineCache local_4f0;
  Move<vk::Handle<(vk::HandleType)18>_> local_4e8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_4c8;
  undefined1 local_4a8 [8];
  VkComputePipelineCreateInfo pipelineCreateInfo;
  VkPipelineShaderStageCreateInfo stageCreateInfo;
  RefData<vk::Handle<(vk::HandleType)14>_> local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  undefined1 local_388 [8];
  VkShaderModuleCreateInfo shaderModuleCreateInfo;
  RefData<vk::Handle<(vk::HandleType)16>_> local_340;
  undefined1 local_320 [8];
  VkPipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  uint local_2dc;
  undefined1 local_2d8 [4];
  deUint32 descriptorNdx;
  DescriptorSetUpdateBuilder builder;
  RefData<vk::Handle<(vk::HandleType)22>_> local_270;
  undefined1 local_250 [8];
  VkDescriptorSetAllocateInfo descriptorSetAllocInfo;
  Move<vk::Handle<(vk::HandleType)21>_> local_210;
  RefData<vk::Handle<(vk::HandleType)21>_> local_1f0;
  Move<vk::Handle<(vk::HandleType)19>_> local_1d0;
  RefData<vk::Handle<(vk::HandleType)19>_> local_1b0;
  uint local_18c;
  undefined1 local_188 [4];
  deUint32 bindingNdx;
  DescriptorSetLayoutBuilder descLayoutBuilder;
  VkDescriptorBufferInfo local_138;
  deUint64 local_120;
  VkDescriptorBufferInfo local_118;
  undefined1 local_100 [8];
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptorInfos;
  RefData<vk::Handle<(vk::HandleType)8>_> local_c8;
  VkDeviceMemory local_a8;
  uint local_a0;
  uint local_9c;
  deUint32 component;
  deUint32 ndx;
  Vec4 *pVec;
  RefData<vk::Handle<(vk::HandleType)8>_> local_70;
  undefined8 local_50;
  VkDeviceSize size;
  VkDevice vkDevice;
  DeviceInterface *vk;
  undefined1 local_21;
  StageFlagVector *pSStack_20;
  bool inRenderPass_local;
  StageFlagVector *stages_local;
  Context *context_local;
  BasicComputeTestInstance *this_local;
  
  local_21 = inRenderPass;
  pSStack_20 = stages;
  stages_local = (StageFlagVector *)context;
  context_local = (Context *)this;
  TimestampTestInstance::TimestampTestInstance
            (&this->super_TimestampTestInstance,context,stages,inRenderPass);
  (this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__BasicComputeTestInstance_016a2f38;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_inputBufAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_inputBuf);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_outputBufAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_outputBuf);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->m_descriptorPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(&this->m_descriptorSet);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move(&this->m_descriptorSetLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(&this->m_pipelineLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(&this->m_computeShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(&this->m_computePipelines);
  vkDevice = (VkDevice)Context::getDeviceInterface((Context *)stages_local);
  size = (VkDeviceSize)Context::getDevice((Context *)stages_local);
  local_50 = 0x40000;
  TimestampTestInstance::createBufferAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&pVec,&this->super_TimestampTestInstance,
             0x40000,0x20,&this->m_inputBufAlloc);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_70,(Move *)&pVec);
  data.deleter.m_deviceIface = local_70.deleter.m_deviceIface;
  data.object.m_internal = local_70.object.m_internal;
  data.deleter.m_device = local_70.deleter.m_device;
  data.deleter.m_allocator = local_70.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_inputBuf,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)&pVec);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_inputBufAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  _component = ::vk::Allocation::getHostPtr(pAVar3);
  for (local_9c = 0; pVVar2 = vkDevice, VVar1 = size, local_9c < 0x4000; local_9c = local_9c + 1) {
    for (local_a0 = 0; local_a0 < 4; local_a0 = local_a0 + 1) {
      uVar12 = local_9c * (local_a0 + 1);
      pfVar4 = tcu::Vector<float,_4>::operator[]
                         ((Vector<float,_4> *)((long)_component + (ulong)local_9c * 0x10),local_a0);
      *pfVar4 = (float)uVar12;
    }
  }
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_inputBufAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  local_a8 = ::vk::Allocation::getMemory(pAVar3);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_inputBufAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  offset = ::vk::Allocation::getOffset(pAVar3);
  ::vk::flushMappedMemoryRange((DeviceInterface *)pVVar2,(VkDevice)VVar1,local_a8,offset,0x40000);
  TimestampTestInstance::createBufferAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &descriptorInfos.
              super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->super_TimestampTestInstance,
             0x40000,0x20,&this->m_outputBufAlloc);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_c8,
             (Move *)&descriptorInfos.
                      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data_00.deleter.m_deviceIface = local_c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_c8.object.m_internal;
  data_00.deleter.m_device = local_c8.deleter.m_device;
  data_00.deleter.m_allocator = local_c8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_outputBuf,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &descriptorInfos.
              super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_100);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_inputBuf).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_120 = pHVar5->m_internal;
  ::vk::makeDescriptorBufferInfo(&local_118,(VkBuffer)local_120,0,0x40000);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::push_back
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_100,&local_118);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_outputBuf).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  descLayoutBuilder.m_immutableSamplers.
  super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar5->m_internal;
  ::vk::makeDescriptorBufferInfo
            (&local_138,
             (VkBuffer)
             descLayoutBuilder.m_immutableSamplers.
             super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0x40000);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::push_back
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_100,&local_138);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_188);
  for (local_18c = 0; local_18c < 2; local_18c = local_18c + 1) {
    ::vk::DescriptorSetLayoutBuilder::addSingleBinding
              ((DescriptorSetLayoutBuilder *)local_188,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  }
  ::vk::DescriptorSetLayoutBuilder::build
            (&local_1d0,(DescriptorSetLayoutBuilder *)local_188,(DeviceInterface *)vkDevice,
             (VkDevice)size,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b0,(Move *)&local_1d0);
  data_01.deleter.m_deviceIface = local_1b0.deleter.m_deviceIface;
  data_01.object.m_internal = local_1b0.object.m_internal;
  data_01.deleter.m_device = local_1b0.deleter.m_device;
  data_01.deleter.m_allocator = local_1b0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
            (&this->m_descriptorSetLayout,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_1d0);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)&descriptorSetAllocInfo.pSetLayouts);
  this_00 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&descriptorSetAllocInfo.pSetLayouts,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
  ::vk::DescriptorPoolBuilder::build
            (&local_210,this_00,(DeviceInterface *)vkDevice,(VkDevice)size,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1f0,(Move *)&local_210);
  data_02.deleter.m_deviceIface = local_1f0.deleter.m_deviceIface;
  data_02.object.m_internal = local_1f0.object.m_internal;
  data_02.deleter.m_device = local_1f0.deleter.m_device;
  data_02.deleter.m_allocator = local_1f0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_210);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)&descriptorSetAllocInfo.pSetLayouts);
  local_250._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  descriptorSetAllocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  descriptorSetAllocInfo._4_4_ = 0;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  descriptorSetAllocInfo.pNext = (void *)pHVar6->m_internal;
  descriptorSetAllocInfo.descriptorPool.m_internal._0_4_ = 1;
  descriptorSetAllocInfo._24_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                 (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &builder.m_copies.
              super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)vkDevice,
             (VkDevice)size,(VkDescriptorSetAllocateInfo *)local_250);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_270,
             (Move *)&builder.m_copies.
                      super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data_03.deleter.m_deviceIface = local_270.deleter.m_deviceIface;
  data_03.object.m_internal = local_270.object.m_internal;
  data_03.deleter.m_device = local_270.deleter.m_device;
  data_03.deleter.m_pool.m_internal = local_270.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=(&this->m_descriptorSet,data_03)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &builder.m_copies.
              super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_2d8);
  for (local_2dc = 0; local_2dc < 2; local_2dc = local_2dc + 1) {
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    destSet.m_internal = pHVar7->m_internal;
    pipelineLayoutCreateInfo.pPushConstantRanges =
         (VkPushConstantRange *)::vk::DescriptorSetUpdateBuilder::Location::binding(local_2dc);
    pBufferInfo = std::
                  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
                  operator[]((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                              *)local_100,(ulong)local_2dc);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              ((DescriptorSetUpdateBuilder *)local_2d8,destSet,
               (Location *)&pipelineLayoutCreateInfo.pPushConstantRanges,
               VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,pBufferInfo);
  }
  ::vk::DescriptorSetUpdateBuilder::update
            ((DescriptorSetUpdateBuilder *)local_2d8,(DeviceInterface *)vkDevice,(VkDevice)size);
  local_320._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineLayoutCreateInfo._4_4_ = 0;
  pipelineLayoutCreateInfo.pNext._0_4_ = 0;
  pipelineLayoutCreateInfo.pNext._4_4_ = 1;
  pipelineLayoutCreateInfo._16_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                 (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  pipelineLayoutCreateInfo.pSetLayouts._0_4_ = 0;
  pipelineLayoutCreateInfo.pushConstantRangeCount = 0;
  pipelineLayoutCreateInfo._36_4_ = 0;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&shaderModuleCreateInfo.pCode,
             (DeviceInterface *)vkDevice,(VkDevice)size,(VkPipelineLayoutCreateInfo *)local_320,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_340,(Move *)&shaderModuleCreateInfo.pCode)
  ;
  data_04.deleter.m_deviceIface = local_340.deleter.m_deviceIface;
  data_04.object.m_internal = local_340.object.m_internal;
  data_04.deleter.m_device = local_340.deleter.m_device;
  data_04.deleter.m_allocator = local_340.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=
            (&this->m_pipelineLayout,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&shaderModuleCreateInfo.pCode);
  local_388._0_4_ = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  shaderModuleCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderModuleCreateInfo._4_4_ = 0;
  shaderModuleCreateInfo.pNext._0_4_ = 0;
  pPVar8 = Context::getBinaryCollection
                     ((this->super_TimestampTestInstance).super_TestInstance.m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"basic_compute",&local_3a9);
  pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar8,&local_3a8);
  shaderModuleCreateInfo._16_8_ = ::vk::ProgramBinary::getSize(pPVar9);
  pPVar8 = Context::getBinaryCollection
                     ((this->super_TimestampTestInstance).super_TestInstance.m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"basic_compute",&local_3d1);
  pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar8,&local_3d0);
  shaderModuleCreateInfo.codeSize = (deUintptr)::vk::ProgramBinary::getBinary(pPVar9);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&stageCreateInfo.pSpecializationInfo,
             (DeviceInterface *)vkDevice,(VkDevice)size,(VkShaderModuleCreateInfo *)local_388,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_3f8,(Move *)&stageCreateInfo.pSpecializationInfo);
  data_05.deleter.m_deviceIface = local_3f8.deleter.m_deviceIface;
  data_05.object.m_internal = local_3f8.object.m_internal;
  data_05.deleter.m_device = local_3f8.deleter.m_device;
  data_05.deleter.m_allocator = local_3f8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
            (&this->m_computeShaderModule,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&stageCreateInfo.pSpecializationInfo);
  pipelineCreateInfo.basePipelineIndex = 0x12;
  stageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  stageCreateInfo._4_4_ = 0;
  stageCreateInfo.pNext._0_4_ = 0;
  stageCreateInfo.pNext._4_4_ = 0x20;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      (&(this->m_computeShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>
                      );
  pipelineCreateInfo.stage._16_8_ = pHVar10->m_internal;
  stageCreateInfo.module.m_internal = (long)"pre_main" + 4;
  stageCreateInfo.pName = (char *)0x0;
  local_4a8._0_4_ = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  pipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.pNext._0_4_ = 0;
  pipelineCreateInfo._20_4_ = pipelineCreateInfo._92_4_;
  pipelineCreateInfo.flags = pipelineCreateInfo.basePipelineIndex;
  pipelineCreateInfo.stage.pNext =
       (void *)CONCAT44(stageCreateInfo.pNext._4_4_,stageCreateInfo.pNext._0_4_);
  pipelineCreateInfo.stage.module.m_internal = (long)"pre_main" + 4;
  pipelineCreateInfo.stage.pName = (char *)0x0;
  pipelineCreateInfo.stage.sType = stageCreateInfo.sType;
  pipelineCreateInfo.stage._4_4_ = stageCreateInfo._4_4_;
  stageCreateInfo._16_8_ = pipelineCreateInfo.stage._16_8_;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  pipelineCreateInfo.stage.pSpecializationInfo = (VkSpecializationInfo *)pHVar11->m_internal;
  ::vk::Handle<(vk::HandleType)18>::Handle
            ((Handle<(vk::HandleType)18> *)&pipelineCreateInfo.layout,0);
  pVVar2 = vkDevice;
  VVar1 = size;
  pipelineCreateInfo.basePipelineHandle.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_4f0,0);
  ::vk::createComputePipeline
            (&local_4e8,(DeviceInterface *)pVVar2,(VkDevice)VVar1,local_4f0,
             (VkComputePipelineCreateInfo *)local_4a8,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4c8,(Move *)&local_4e8);
  data_06.deleter.m_deviceIface = local_4c8.deleter.m_deviceIface;
  data_06.object.m_internal = local_4c8.object.m_internal;
  data_06.deleter.m_device = local_4c8.deleter.m_device;
  data_06.deleter.m_allocator = local_4c8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=
            (&this->m_computePipelines,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_4e8);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_2d8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_188);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::~vector
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_100);
  return;
}

Assistant:

BasicComputeTestInstance::BasicComputeTestInstance(Context&              context,
												   const StageFlagVector stages,
												   const bool            inRenderPass)
	: TimestampTestInstance(context, stages, inRenderPass)
{
	const DeviceInterface&      vk                  = context.getDeviceInterface();
	const VkDevice              vkDevice            = context.getDevice();

	// Create buffer object, allocate storage, and generate input data
	const VkDeviceSize          size                = sizeof(tcu::Vec4) * 128u * 128u;
	m_inputBuf = createBufferAndBindMemory(size, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT, &m_inputBufAlloc);
	// Load vertices into buffer
	tcu::Vec4* pVec = reinterpret_cast<tcu::Vec4*>(m_inputBufAlloc->getHostPtr());
	for (deUint32 ndx = 0u; ndx < (128u * 128u); ndx++)
	{
		for (deUint32 component = 0u; component < 4u; component++)
		{
			pVec[ndx][component]= (float)(ndx * (component + 1u));
		}
	}
	flushMappedMemoryRange(vk, vkDevice, m_inputBufAlloc->getMemory(), m_inputBufAlloc->getOffset(), size);

	m_outputBuf = createBufferAndBindMemory(size, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT, &m_outputBufAlloc);

	std::vector<VkDescriptorBufferInfo>        descriptorInfos;
	descriptorInfos.push_back(makeDescriptorBufferInfo(*m_inputBuf, 0u, size));
	descriptorInfos.push_back(makeDescriptorBufferInfo(*m_outputBuf, 0u, size));

	// Create descriptor set layout
	DescriptorSetLayoutBuilder descLayoutBuilder;

	for (deUint32 bindingNdx = 0u; bindingNdx < 2u; bindingNdx++)
	{
		descLayoutBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT);
	}

	m_descriptorSetLayout = descLayoutBuilder.build(vk, vkDevice);

	// Create descriptor pool
	m_descriptorPool = DescriptorPoolBuilder().addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2).build(vk, vkDevice, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	// Create descriptor set
	const VkDescriptorSetAllocateInfo descriptorSetAllocInfo =
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,     // VkStructureType                 sType;
		DE_NULL,                                            // const void*                     pNext;
		*m_descriptorPool,                                  // VkDescriptorPool                descriptorPool;
		1u,                                                 // deUint32                        setLayoutCount;
		&m_descriptorSetLayout.get(),                       // const VkDescriptorSetLayout*    pSetLayouts;
	};
	m_descriptorSet   = allocateDescriptorSet(vk, vkDevice, &descriptorSetAllocInfo);

	DescriptorSetUpdateBuilder  builder;
	for (deUint32 descriptorNdx = 0u; descriptorNdx < 2u; descriptorNdx++)
	{
		builder.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(descriptorNdx), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorInfos[descriptorNdx]);
	}
	builder.update(vk, vkDevice);

	// Create compute pipeline layout
	const VkPipelineLayoutCreateInfo pipelineLayoutCreateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,  // VkStructureType                 sType;
		DE_NULL,                                        // const void*                     pNext;
		0u,                                             // VkPipelineLayoutCreateFlags     flags;
		1u,                                             // deUint32                        setLayoutCount;
		&m_descriptorSetLayout.get(),                   // const VkDescriptorSetLayout*    pSetLayouts;
		0u,                                             // deUint32                        pushConstantRangeCount;
		DE_NULL,                                        // const VkPushConstantRange*      pPushConstantRanges;
	};

	m_pipelineLayout = createPipelineLayout(vk, vkDevice, &pipelineLayoutCreateInfo);

	// Create compute shader
	VkShaderModuleCreateInfo shaderModuleCreateInfo =
	{
		VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO,                        // VkStructureType             sType;
		DE_NULL,                                                            // const void*                 pNext;
		0u,                                                                 // VkShaderModuleCreateFlags   flags;
		m_context.getBinaryCollection().get("basic_compute").getSize(),     // deUintptr                   codeSize;
		(deUint32*)m_context.getBinaryCollection().get("basic_compute").getBinary(),   // const deUint32*             pCode;

	};

	m_computeShaderModule = createShaderModule(vk, vkDevice, &shaderModuleCreateInfo);

	// Create compute pipeline
	const VkPipelineShaderStageCreateInfo stageCreateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO, // VkStructureType                     sType;
		DE_NULL,                                             // const void*                         pNext;
		0u,                                                  // VkPipelineShaderStageCreateFlags    flags;
		VK_SHADER_STAGE_COMPUTE_BIT,                         // VkShaderStageFlagBits               stage;
		*m_computeShaderModule,                              // VkShaderModule                      module;
		"main",                                              // const char*                         pName;
		DE_NULL,                                             // const VkSpecializationInfo*         pSpecializationInfo;
	};

	const VkComputePipelineCreateInfo pipelineCreateInfo =
	{
		VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,      // VkStructureType                 sType;
		DE_NULL,                                             // const void*                     pNext;
		0u,                                                  // VkPipelineCreateFlags           flags;
		stageCreateInfo,                                     // VkPipelineShaderStageCreateInfo stage;
		*m_pipelineLayout,                                   // VkPipelineLayout                layout;
		(VkPipeline)0,                                       // VkPipeline                      basePipelineHandle;
		0u,                                                  // deInt32                         basePipelineIndex;
	};

	m_computePipelines = createComputePipeline(vk, vkDevice, (VkPipelineCache)0u, &pipelineCreateInfo);

}